

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLRSAPrivateKey.cpp
# Opt level: O3

void __thiscall OSSLRSAPrivateKey::~OSSLRSAPrivateKey(OSSLRSAPrivateKey *this)

{
  *(undefined ***)&this->super_RSAPrivateKey = &PTR_serialise_0019d520;
  RSA_free((RSA *)this->rsa);
  *(undefined ***)&this->super_RSAPrivateKey = &PTR_serialise_0019bb80;
  (this->super_RSAPrivateKey).e._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&(this->super_RSAPrivateKey).e.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  (this->super_RSAPrivateKey).n._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&(this->super_RSAPrivateKey).n.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  (this->super_RSAPrivateKey).d._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&(this->super_RSAPrivateKey).d.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  (this->super_RSAPrivateKey).dq1._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&(this->super_RSAPrivateKey).dq1.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  (this->super_RSAPrivateKey).dp1._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&(this->super_RSAPrivateKey).dp1.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  (this->super_RSAPrivateKey).pq._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&(this->super_RSAPrivateKey).pq.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  (this->super_RSAPrivateKey).q._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&(this->super_RSAPrivateKey).q.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  (this->super_RSAPrivateKey).p._vptr_ByteString = (_func_int **)&PTR__ByteString_0019d880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&(this->super_RSAPrivateKey).p.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  return;
}

Assistant:

OSSLRSAPrivateKey::~OSSLRSAPrivateKey()
{
	RSA_free(rsa);
}